

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O1

void __thiscall Json::Value::setComment(Value *this,char *comment,CommentPlacement placement)

{
  undefined8 *puVar1;
  CommentInfo *this_00;
  long lVar2;
  
  if (this->comments_ == (CommentInfo *)0x0) {
    puVar1 = (undefined8 *)operator_new__(0x20);
    *puVar1 = 3;
    lVar2 = 0;
    this_00 = (CommentInfo *)(puVar1 + 1);
    do {
      CommentInfo::CommentInfo(this_00);
      lVar2 = lVar2 + -8;
      this_00 = this_00 + 1;
    } while (lVar2 != -0x18);
    this->comments_ = (CommentInfo *)(puVar1 + 1);
  }
  CommentInfo::setComment(this->comments_ + placement,comment);
  return;
}

Assistant:

void 
Value::setComment( const char *comment,
                   CommentPlacement placement )
{
   if ( !comments_ )
      comments_ = new CommentInfo[numberOfCommentPlacement];
   comments_[placement].setComment( comment );
}